

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one.hpp
# Opt level: O0

bool tao::pegtl::internal::contains<char>(char c,initializer_list<char> *l)

{
  initializer_list<char> *this;
  char *pcVar1;
  const_iterator pcVar2;
  initializer_list<char> *in_RSI;
  undefined1 in_DIL;
  char *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  
  this = (initializer_list<char> *)std::initializer_list<char>::begin(in_RSI);
  std::initializer_list<char>::end(this);
  pcVar1 = std::find<char_const*,char>
                     (unaff_retaddr,(char *)CONCAT17(in_DIL,in_stack_fffffffffffffff8),
                      (char *)in_RSI);
  pcVar2 = std::initializer_list<char>::end(this);
  return pcVar1 != pcVar2;
}

Assistant:

bool contains( const Char c, const std::initializer_list< Char >& l ) noexcept
         {
            return std::find( l.begin(), l.end(), c ) != l.end();
         }